

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdClient.hpp
# Opt level: O2

void __thiscall
Statsd::StatsdClient::StatsdClient
          (StatsdClient *this,string *host,uint16_t port,string *prefix,uint64_t batchsize,
          uint64_t sendInterval,int gaugePrecision)

{
  uint seed;
  UDPSender *this_00;
  string sStack_13d8;
  random_device local_13b8;
  
  std::__cxx11::string::string((string *)&sStack_13d8,(string *)prefix);
  detail::sanitizePrefix(&this->m_prefix,&sStack_13d8);
  std::__cxx11::string::~string((string *)&sStack_13d8);
  this_00 = (UDPSender *)operator_new(0xf0);
  UDPSender::UDPSender(this_00,host,port,batchsize,sendInterval);
  (this->m_sender)._M_t.
  super___uniq_ptr_impl<Statsd::UDPSender,_std::default_delete<Statsd::UDPSender>_>._M_t.
  super__Tuple_impl<0UL,_Statsd::UDPSender_*,_std::default_delete<Statsd::UDPSender>_>.
  super__Head_base<0UL,_Statsd::UDPSender_*,_false>._M_head_impl = this_00;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&this->m_randomEngine);
  this->m_gaugePrecision = gaugePrecision;
  std::random_device::random_device(&local_13b8);
  seed = std::random_device::_M_getval();
  StatsdClient::seed(this,seed);
  std::random_device::~random_device(&local_13b8);
  return;
}

Assistant:

inline StatsdClient::StatsdClient(const std::string& host,
                                  const uint16_t port,
                                  const std::string& prefix,
                                  const uint64_t batchsize,
                                  const uint64_t sendInterval,
                                  const int gaugePrecision) noexcept
    : m_prefix(detail::sanitizePrefix(prefix)),
      m_sender(new UDPSender{host, port, batchsize, sendInterval}),
      m_gaugePrecision(gaugePrecision) {
    // Initialize the random generator to be used for sampling
    seed();
}